

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_upload.c
# Opt level: O1

Qiniu_Error
upload_one_part(Qiniu_Client *client,Qiniu_Multipart_PutExtra *extraParam,char *path,int partNum,
               Qiniu_ReaderAt reader,Qiniu_Int64 partOffset,Qiniu_Int64 partSize,char *md5str,
               Qiniu_UploadPartResp *ret,_Qiniu_Progress_Callback_Data *progressCallback)

{
  ulong uVar1;
  Qiniu_ReaderAt r;
  uint code;
  Qiniu_Retry_Decision QVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  Qiniu_Reader body;
  Qiniu_Error QVar8;
  Qiniu_Error QVar9;
  Qiniu_Json *callRet;
  _func_int_void_ptr_double_double_double_double *local_98;
  Qiniu_Multipart_PutExtra *local_90;
  size_t local_88;
  Qiniu_Client *local_80;
  _Qiniu_Progress_Callback_Data *local_78;
  char *local_70;
  void *local_68;
  Qiniu_FnReadAt local_60;
  Qiniu_Section section;
  
  local_60 = reader.ReadAt;
  local_68 = reader.self;
  if (progressCallback == (_Qiniu_Progress_Callback_Data *)0x0) {
    progressCallback = (_Qiniu_Progress_Callback_Data *)0x0;
    local_98 = (_func_int_void_ptr_double_double_double_double *)0x0;
  }
  else {
    bVar7 = progressCallback->callback == (_func_void_size_t_size_t *)0x0;
    if (bVar7) {
      progressCallback = (_Qiniu_Progress_Callback_Data *)0x0;
    }
    local_98 = _Qiniu_Progress_Callback;
    if (bVar7) {
      local_98 = (_func_int_void_ptr_double_double_double_double *)0x0;
    }
  }
  local_88 = 1;
  local_90 = extraParam;
  if (extraParam->upHost == (char *)0x0) {
    local_90 = (Qiniu_Multipart_PutExtra *)extraParam->upHosts;
    local_88 = extraParam->upHostsCount;
  }
  pcVar5 = Qiniu_OK.message;
  code = Qiniu_OK.code;
  local_80 = client;
  local_70 = path;
  if (0 < extraParam->tryTimes) {
    uVar6 = 0xffffffffffffffff;
    local_78 = progressCallback;
    while( true ) {
      uVar1 = uVar6 + 1;
      section.off = 0;
      section.limit = 0;
      section.r.self = (void *)0x0;
      section.r.ReadAt = (Qiniu_FnReadAt)0x0;
      r.ReadAt = local_60;
      r.self = local_68;
      body = Qiniu_SectionReader(&section,r,partOffset,partSize);
      callRet = (Qiniu_Json *)0x0;
      pcVar3 = Qiniu_String_Concat((&local_90->upHost)[uVar1 % local_88],local_70,0);
      QVar8 = Qiniu_Client_CallWithMethodAndProgressCallback
                        (local_80,&callRet,pcVar3,body,partSize,(char *)0x0,"PUT",md5str,local_98,
                         local_78);
      pcVar5 = QVar8.message;
      code = QVar8.code;
      Qiniu_Free(pcVar3);
      if (code == 200) break;
      QVar2 = _Qiniu_Should_Retry(code);
      if (((QVar2 == QINIU_DONT_RETRY) || ((long)extraParam->tryTimes <= (long)(uVar6 + 2))) ||
         (uVar6 = uVar1, local_80->hostsRetriesMax <= uVar1)) goto LAB_0012403f;
    }
    if (ret != (Qiniu_UploadPartResp *)0x0) {
      pcVar3 = Qiniu_Json_GetString(callRet,"md5",(char *)0x0);
      pcVar4 = Qiniu_Json_GetString(callRet,"etag",(char *)0x0);
      pcVar4 = Qiniu_String_Dup(pcVar4);
      ret->etag = pcVar4;
      pcVar3 = Qiniu_String_Dup(pcVar3);
      ret->md5 = pcVar3;
      ret->partNum = partNum;
    }
  }
LAB_0012403f:
  if (code == 200) {
    if (extraParam->notify != (NotifyFunc)0x0) {
      (*extraParam->notify)(ret);
    }
  }
  else if (extraParam->notifyErr != (NotifyErrFunc)0x0) {
    QVar8._4_4_ = 0;
    QVar8.code = code;
    QVar8.message = pcVar5;
    (*extraParam->notifyErr)(partNum,QVar8);
  }
  QVar9._4_4_ = 0;
  QVar9.code = code;
  QVar9.message = pcVar5;
  return QVar9;
}

Assistant:

Qiniu_Error upload_one_part(Qiniu_Client *client, Qiniu_Multipart_PutExtra *extraParam, const char *path,
                            int partNum, Qiniu_ReaderAt reader, Qiniu_Int64 partOffset, Qiniu_Int64 partSize, const char *md5str,
                            Qiniu_UploadPartResp *ret, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Error err = Qiniu_OK;
    const char *const *upHosts;
    size_t upHostsCount;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    if (extraParam->upHost != NULL)
    {
        upHosts = &extraParam->upHost;
        upHostsCount = 1;
    }
    else
    {
        upHosts = extraParam->upHosts;
        upHostsCount = extraParam->upHostsCount;
    }
    for (int tries = 0; tries < extraParam->tryTimes && tries <= client->hostsRetriesMax; tries++)
    {
        Qiniu_Section section;
        Qiniu_Zero(section);
        Qiniu_Reader thisPartBody = Qiniu_SectionReader(&section, reader, (Qiniu_Off_T)partOffset, partSize);
        Qiniu_Json *callRet = NULL; // don't cJSON_Delete(callRet), it will be automatically freed on next http request by Qiniu_Client_Call.
        const char *upHost = upHosts[tries % upHostsCount];
        const char *reqUrl = Qiniu_String_Concat(upHost, path, NULL);
        err = Qiniu_Client_CallWithMethodAndProgressCallback(client, &callRet, reqUrl, thisPartBody, partSize, NULL, "PUT", md5str, callback, callbackData);
        Qiniu_Free((void *)reqUrl);
        if (err.code == 200)
        {
            if (ret != NULL)
            {
                const char *md5 = Qiniu_Json_GetString(callRet, "md5", NULL);
                const char *etag = Qiniu_Json_GetString(callRet, "etag", NULL);
                ret->etag = Qiniu_String_Dup(etag);
                ret->md5 = Qiniu_String_Dup(md5);
                ret->partNum = partNum;
            }
            break;
        }
        else if (_Qiniu_Should_Retry(err.code) == QINIU_DONT_RETRY)
        {
            break;
        }
    }
    // notify callback
    if (err.code == 200 && extraParam->notify)
    {
        extraParam->notify(ret);
    }
    else if (err.code != 200 && extraParam->notifyErr)
    {
        extraParam->notifyErr(partNum, err);
    }

    return err;
}